

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O3

bool __thiscall r_code::Atom::readsAsNil(Atom *this)

{
  uint32_t uVar1;
  
  uVar1 = this->atom;
  if ((int)uVar1 < -0x5d000001) {
    if ((int)uVar1 < -0x5f000001) {
      if (uVar1 != 0x81ffffff) {
        return false;
      }
    }
    else if ((uVar1 != 0xa0ffffff) && (uVar1 != 0xa1ffffff)) {
      return false;
    }
  }
  else if ((int)uVar1 < -0x39000001) {
    if ((uVar1 != 0xa2ffffff) && (uVar1 != 0xc1000000)) {
      return false;
    }
  }
  else if ((uVar1 != 0xc6ffffff) && (uVar1 != 0x3fffffff)) {
    return false;
  }
  return true;
}

Assistant:

bool Atom::readsAsNil() const
{
    return atom == 0x80000000 ||
           atom == 0x3FFFFFFF ||
           atom == 0x81FFFFFF ||
           atom == 0xC1000000 ||
           atom == 0xA0FFFFFF ||
           atom == 0xA1FFFFFF ||
           atom == 0xA2FFFFFF ||
           atom == 0xC6FFFFFF;
}